

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O3

void proc_pool_join(ProcPool *pool)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int32_t i;
  long lVar4;
  char **ppcVar5;
  long lVar6;
  
  do {
    iVar1 = pool_sync2(pool);
  } while (-1 < iVar1);
  iVar2 = pool->max_num_procs;
  if (0 < iVar2) {
    ppcVar5 = pool->procs[0].args;
    lVar6 = 0;
    do {
      if (pool->procs[lVar6].valid == true) {
        pool->procs[lVar6].pid = -0x80000000;
        lVar4 = 0;
        do {
          free(ppcVar5[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x100);
        memset(pool->procs + lVar6,0,0x810);
        iVar2 = pool->max_num_procs;
      }
      lVar6 = lVar6 + 1;
      iVar3 = 0x10;
      if (iVar2 < 0x10) {
        iVar3 = iVar2;
      }
      ppcVar5 = ppcVar5 + 0x102;
    } while (lVar6 < iVar3);
  }
  return;
}

Assistant:

void proc_pool_join(ProcPool *pool) {
    while ((pool_sync2(pool) >= 0)) {
    }

    // NOTE: Technically this loop is not necessary since `pool_sync` will take
    //       care of destroying terminated process. But we live it here for
    //       the sake of clarity
    for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
         idx++) {
        if (pool->procs[idx].valid) {
            proc_destroy(&pool->procs[idx]);
        }
    }
}